

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InetAddress.cpp
# Opt level: O3

bool sznet::net::InetAddress::resolve(StringArg hostname,InetAddress *out)

{
  int iVar1;
  bool bVar2;
  SourceFile file;
  Logger local_ff0;
  addrinfo *local_20;
  addrinfo *res;
  
  if (out != (InetAddress *)0x0) {
    local_20 = (addrinfo *)0x0;
    iVar1 = getaddrinfo(hostname.m_str,(char *)0x0,(addrinfo *)0x0,&local_20);
    bVar2 = local_20 != (addrinfo *)0x0;
    if (bVar2 && iVar1 == 0) {
      (out->field_0).m_addr.sin_addr.s_addr = *(in_addr_t *)local_20->ai_addr;
      freeaddrinfo(local_20);
    }
    else if (iVar1 != 0) {
      file._8_8_ = 0xf;
      file.m_data = "InetAddress.cpp";
      Logger::Logger(&local_ff0,file,0x95,false);
      if (0x14 < (uint)(((int)&local_ff0 + 0xfb0) - (int)local_ff0.m_impl.m_stream.m_buffer.m_cur))
      {
        builtin_strncpy(local_ff0.m_impl.m_stream.m_buffer.m_cur,"InetAddress::resolve",0x14);
        local_ff0.m_impl.m_stream.m_buffer.m_cur = local_ff0.m_impl.m_stream.m_buffer.m_cur + 0x14;
      }
      Logger::~Logger(&local_ff0);
    }
    return bVar2 && iVar1 == 0;
  }
  __assert_fail("out != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/InetAddress.cpp"
                ,0x88,"static bool sznet::net::InetAddress::resolve(StringArg, InetAddress *)");
}

Assistant:

bool InetAddress::resolve(StringArg hostname, InetAddress* out)
{
	assert(out != nullptr);
	struct addrinfo *res = nullptr;
	int ret = getaddrinfo(hostname.c_str(), nullptr, 0, &res);
	if (ret == 0 && res != nullptr)
	{
		out->m_addr.sin_addr = *reinterpret_cast<struct in_addr*>(res->ai_addr);
		freeaddrinfo(res);
		return true;
	}
	else
	{
		if (ret)
		{
			LOG_SYSERR << "InetAddress::resolve";
		}
		return false;
	}
}